

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gga.c
# Opt level: O2

void xc_gga_vxc_fxc_kxc(xc_func_type *p,size_t np,double *rho,double *sigma,double *vrho,
                       double *vsigma,double *v2rho2,double *v2rhosigma,double *v2sigma2,
                       double *v3rho3,double *v3rho2sigma,double *v3rhosigma2,double *v3sigma3)

{
  xc_gga_out_params out;
  
  out.zk = (double *)0x0;
  out.v4sigma4 = (double *)0x0;
  out.v4rho2sigma2 = (double *)0x0;
  out.v4rhosigma3 = (double *)0x0;
  out.v4rho4 = (double *)0x0;
  out.v4rho3sigma = (double *)0x0;
  out.v2rho2 = v2rho2;
  out.v2rhosigma = v2rhosigma;
  out.v2sigma2 = v2sigma2;
  out.v3rho3 = v3rho3;
  out.v3rho2sigma = v3rho2sigma;
  out.v3rhosigma2 = v3rhosigma2;
  out.v3sigma3 = v3sigma3;
  out.vrho = vrho;
  out.vsigma = vsigma;
  xc_gga_new(p,3,np,rho,sigma,&out);
  return;
}

Assistant:

void
xc_gga_vxc_fxc_kxc (const xc_func_type *p, size_t np, const double *rho, const double *sigma,
                    double *vrho, double *vsigma, double *v2rho2, double *v2rhosigma, double *v2sigma2,
                    double *v3rho3, double *v3rho2sigma, double *v3rhosigma2, double *v3sigma3)
{
  xc_gga_out_params out;
  libxc_memset(&out, 0, sizeof(xc_gga_out_params));
  out.vrho   = vrho; out.vsigma = vsigma;
  out.v2rho2 = v2rho2; out.v2rhosigma = v2rhosigma; out.v2sigma2 = v2sigma2;
  out.v3rho3 = v3rho3; out.v3rho2sigma = v3rho2sigma; out.v3rhosigma2 = v3rhosigma2; out.v3sigma3 = v3sigma3;

  xc_gga_new(p, 3, np, rho, sigma, &out);
}